

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O0

bool ImGui::DragBehaviorT<unsigned_long_long,long_long,double>
               (ImGuiDataType data_type,unsigned_long_long *v,float v_speed,unsigned_long_long v_min
               ,unsigned_long_long v_max,char *format,ImGuiSliderFlags flags)

{
  ImGuiContext *pIVar1;
  bool bVar2;
  uint uVar3;
  float *pfVar4;
  ulong v_00;
  ulong in_RCX;
  ulong in_RDX;
  ulong *in_RSI;
  int in_EDI;
  uint in_R9D;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  bool bVar8;
  float in_XMM0_Da;
  float fVar9;
  float fVar10;
  float in_stack_0000001c;
  float in_stack_00000020;
  bool in_stack_00000027;
  unsigned_long_long in_stack_00000028;
  unsigned_long_long in_stack_00000030;
  undefined4 in_stack_00000038;
  float in_stack_0000003c;
  float in_stack_00000040;
  bool in_stack_00000047;
  unsigned_long_long in_stack_00000048;
  float v_new_parametric_1;
  float v_new_parametric;
  float v_old_parametric;
  int decimal_precision_1;
  float zero_deadzone_halfsize;
  float logarithmic_zero_epsilon;
  double v_old_ref_for_accum_remainder;
  unsigned_long_long v_cur;
  bool is_already_past_limits_and_pushing_outward;
  bool is_just_activated;
  float tweak_factor;
  bool tweak_fast;
  bool tweak_slow;
  int decimal_precision;
  float adjust_delta;
  bool is_floating_point;
  bool is_logarithmic;
  bool is_clamped;
  ImGuiAxis axis;
  ImGuiContext *g;
  int in_stack_ffffffffffffff30;
  ushort uVar11;
  uint in_stack_ffffffffffffff34;
  char cVar12;
  float in_stack_ffffffffffffff38;
  float in_stack_ffffffffffffff3c;
  ImGuiAxis in_stack_ffffffffffffff44;
  float local_b4;
  float local_a8;
  float local_a4;
  float local_98;
  float local_90;
  bool local_89;
  undefined4 in_stack_ffffffffffffffa4;
  uint uVar13;
  ImGuiDataType data_type_00;
  float in_stack_ffffffffffffffa8;
  undefined2 in_stack_ffffffffffffffac;
  undefined1 in_stack_ffffffffffffffae;
  byte in_stack_ffffffffffffffaf;
  float local_4c;
  float local_14;
  bool local_1;
  char cVar14;
  
  pIVar1 = GImGui;
  uVar3 = (uint)((in_R9D & 0x100000) != 0);
  bVar5 = in_RDX < in_RCX;
  bVar6 = (in_R9D & 0x20) != 0;
  bVar7 = in_EDI == 8;
  bVar8 = in_EDI == 9;
  local_89 = bVar7 || bVar8;
  local_14 = in_XMM0_Da;
  if ((((in_XMM0_Da == 0.0) && (!NAN(in_XMM0_Da))) && (bVar5)) &&
     (local_90 = (float)(in_RCX - in_RDX), local_90 < 3.4028235e+38)) {
    local_98 = (float)(in_RCX - in_RDX);
    local_14 = local_98 * GImGui->DragSpeedDefaultRatio;
  }
  local_4c = 0.0;
  if (((GImGui->ActiveIdSource == ImGuiInputSource_Mouse) &&
      (bVar2 = IsMousePosValid((ImVec2 *)0x0), bVar2)) &&
     (bVar2 = IsMouseDragPastThreshold(0,(pIVar1->IO).MouseDragThreshold * 0.5), bVar2)) {
    pfVar4 = ImVec2::operator[](&(pIVar1->IO).MouseDelta,(long)(int)uVar3);
    local_4c = *pfVar4;
    if (((pIVar1->IO).KeyAlt & 1U) != 0) {
      local_4c = local_4c * 0.01;
    }
    if (((pIVar1->IO).KeyShift & 1U) != 0) {
      local_4c = local_4c * 10.0;
    }
  }
  else if (pIVar1->ActiveIdSource == ImGuiInputSource_Nav) {
    if (bVar7 || bVar8) {
      ImParseFormatPrecision
                ((char *)CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38),
                 in_stack_ffffffffffffff34);
    }
    in_stack_ffffffffffffffaf = IsKeyDown(ImGuiKey_KeysData_OFFSET);
    in_stack_ffffffffffffffae = IsKeyDown(ImGuiKey_KeysData_OFFSET);
    if ((in_stack_ffffffffffffffaf & 1) == 0) {
      local_a8 = 10.0;
      if (!(bool)in_stack_ffffffffffffffae) {
        local_a8 = 1.0;
      }
      local_a4 = local_a8;
    }
    else {
      local_a4 = 1.0;
    }
    local_4c = GetNavTweakPressedAmount(in_stack_ffffffffffffff44);
    local_4c = local_4c * local_a4;
    fVar9 = GetMinimumStepAtDecimalPrecision(in_stack_ffffffffffffff30);
    local_14 = ImMax<float>(local_14,fVar9);
    in_stack_ffffffffffffffa8 = local_a4;
  }
  local_4c = local_14 * local_4c;
  if (uVar3 == 1) {
    local_4c = -local_4c;
  }
  if (((bVar6) && (local_b4 = (float)(in_RCX - in_RDX), local_b4 < 3.4028235e+38)) &&
     (1e-06 < (float)(in_RCX - in_RDX))) {
    in_stack_ffffffffffffff38 = (float)(long)(in_RCX - in_RDX);
    in_stack_ffffffffffffff3c = (float)(in_RCX - in_RDX);
    local_4c = local_4c / in_stack_ffffffffffffff3c;
  }
  uVar13 = CONCAT13(pIVar1->ActiveIdIsJustActivated,(int3)in_stack_ffffffffffffffa4) & 0x1ffffff;
  uVar3 = in_stack_ffffffffffffff34 & 0xffffff;
  if (bVar5) {
    if ((*in_RSI < in_RCX) || (uVar3 = (uint)CONCAT12(1,(short)uVar3), local_4c <= 0.0)) {
      uVar11 = (ushort)uVar3 & 0xff;
      if (*in_RSI <= in_RDX) {
        uVar11 = CONCAT11(local_4c < 0.0,(char)uVar3);
      }
      uVar3 = (uint)CONCAT12((char)(uVar11 >> 8),uVar11);
    }
    uVar3 = CONCAT13((char)(uVar3 >> 0x10),(int3)uVar3);
  }
  cVar12 = (char)(uVar3 >> 0x18);
  cVar14 = (char)(uVar13 >> 0x18);
  data_type_00 = CONCAT13(cVar14,CONCAT12(cVar12,(short)uVar13));
  if ((cVar14 == '\0') && (cVar12 == '\0')) {
    if ((local_4c != 0.0) || (NAN(local_4c))) {
      pIVar1->DragCurrentAccum = local_4c + pIVar1->DragCurrentAccum;
      pIVar1->DragCurrentAccumDirty = true;
    }
  }
  else {
    pIVar1->DragCurrentAccum = 0.0;
    pIVar1->DragCurrentAccumDirty = false;
  }
  if ((pIVar1->DragCurrentAccumDirty & 1U) == 0) {
    local_1 = false;
  }
  else {
    fVar9 = 0.0;
    if (bVar6) {
      if (bVar7 || bVar8) {
        ImParseFormatPrecision
                  ((char *)CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38),uVar3);
      }
      ImPow(0.0,7.433312e-39);
      fVar9 = ScaleRatioFromValueT<unsigned_long_long,long_long,double>
                        ((ImGuiDataType)in_stack_00000040,
                         CONCAT44(in_stack_0000003c,in_stack_00000038),in_stack_00000030,
                         in_stack_00000028,in_stack_00000027,in_stack_00000020,in_stack_0000001c);
      v_00 = ScaleValueFromRatioT<unsigned_long_long,long_long,double>
                       (decimal_precision_1,v_old_parametric,_v_new_parametric_1,in_stack_00000048,
                        in_stack_00000047,in_stack_00000040,in_stack_0000003c);
    }
    else {
      v_00 = (long)pIVar1->DragCurrentAccum + *in_RSI;
    }
    if ((local_89) && ((in_R9D & 0x40) == 0)) {
      v_00 = RoundScalarWithFormatT<unsigned_long_long>
                       ((char *)CONCAT17(in_stack_ffffffffffffffaf,
                                         CONCAT16(in_stack_ffffffffffffffae,
                                                  CONCAT24(in_stack_ffffffffffffffac,
                                                           in_stack_ffffffffffffffa8))),data_type_00
                        ,v_00);
    }
    pIVar1->DragCurrentAccumDirty = false;
    if (bVar6) {
      fVar10 = ScaleRatioFromValueT<unsigned_long_long,long_long,double>
                         ((ImGuiDataType)in_stack_00000040,
                          CONCAT44(in_stack_0000003c,in_stack_00000038),in_stack_00000030,
                          in_stack_00000028,in_stack_00000027,in_stack_00000020,in_stack_0000001c);
      pIVar1->DragCurrentAccum = pIVar1->DragCurrentAccum - (fVar10 - fVar9);
    }
    else {
      pIVar1->DragCurrentAccum = pIVar1->DragCurrentAccum - (float)(long)(v_00 - *in_RSI);
    }
    if (v_00 == 0) {
      v_00 = 0;
    }
    if ((*in_RSI != v_00) && (bVar5)) {
      if ((v_00 < in_RDX) || (((*in_RSI < v_00 && (local_4c < 0.0)) && (!bVar7 && !bVar8)))) {
        v_00 = in_RDX;
      }
      if ((in_RCX < v_00) || (((v_00 < *in_RSI && (0.0 < local_4c)) && (!bVar7 && !bVar8)))) {
        v_00 = in_RCX;
      }
    }
    if (*in_RSI == v_00) {
      local_1 = false;
    }
    else {
      *in_RSI = v_00;
      local_1 = true;
    }
  }
  return local_1;
}

Assistant:

bool ImGui::DragBehaviorT(ImGuiDataType data_type, TYPE* v, float v_speed, const TYPE v_min, const TYPE v_max, const char* format, ImGuiSliderFlags flags)
{
    ImGuiContext& g = *GImGui;
    const ImGuiAxis axis = (flags & ImGuiSliderFlags_Vertical) ? ImGuiAxis_Y : ImGuiAxis_X;
    const bool is_clamped = (v_min < v_max);
    const bool is_logarithmic = (flags & ImGuiSliderFlags_Logarithmic) != 0;
    const bool is_floating_point = (data_type == ImGuiDataType_Float) || (data_type == ImGuiDataType_Double);

    // Default tweak speed
    if (v_speed == 0.0f && is_clamped && (v_max - v_min < FLT_MAX))
        v_speed = (float)((v_max - v_min) * g.DragSpeedDefaultRatio);

    // Inputs accumulates into g.DragCurrentAccum, which is flushed into the current value as soon as it makes a difference with our precision settings
    float adjust_delta = 0.0f;
    if (g.ActiveIdSource == ImGuiInputSource_Mouse && IsMousePosValid() && IsMouseDragPastThreshold(0, g.IO.MouseDragThreshold * DRAG_MOUSE_THRESHOLD_FACTOR))
    {
        adjust_delta = g.IO.MouseDelta[axis];
        if (g.IO.KeyAlt)
            adjust_delta *= 1.0f / 100.0f;
        if (g.IO.KeyShift)
            adjust_delta *= 10.0f;
    }
    else if (g.ActiveIdSource == ImGuiInputSource_Nav)
    {
        const int decimal_precision = is_floating_point ? ImParseFormatPrecision(format, 3) : 0;
        const bool tweak_slow = IsKeyDown((g.NavInputSource == ImGuiInputSource_Gamepad) ? ImGuiKey_NavGamepadTweakSlow : ImGuiKey_NavKeyboardTweakSlow);
        const bool tweak_fast = IsKeyDown((g.NavInputSource == ImGuiInputSource_Gamepad) ? ImGuiKey_NavGamepadTweakFast : ImGuiKey_NavKeyboardTweakFast);
        const float tweak_factor = tweak_slow ? 1.0f / 1.0f : tweak_fast ? 10.0f : 1.0f;
        adjust_delta = GetNavTweakPressedAmount(axis) * tweak_factor;
        v_speed = ImMax(v_speed, GetMinimumStepAtDecimalPrecision(decimal_precision));
    }
    adjust_delta *= v_speed;

    // For vertical drag we currently assume that Up=higher value (like we do with vertical sliders). This may become a parameter.
    if (axis == ImGuiAxis_Y)
        adjust_delta = -adjust_delta;

    // For logarithmic use our range is effectively 0..1 so scale the delta into that range
    if (is_logarithmic && (v_max - v_min < FLT_MAX) && ((v_max - v_min) > 0.000001f)) // Epsilon to avoid /0
        adjust_delta /= (float)(v_max - v_min);

    // Clear current value on activation
    // Avoid altering values and clamping when we are _already_ past the limits and heading in the same direction, so e.g. if range is 0..255, current value is 300 and we are pushing to the right side, keep the 300.
    bool is_just_activated = g.ActiveIdIsJustActivated;
    bool is_already_past_limits_and_pushing_outward = is_clamped && ((*v >= v_max && adjust_delta > 0.0f) || (*v <= v_min && adjust_delta < 0.0f));
    if (is_just_activated || is_already_past_limits_and_pushing_outward)
    {
        g.DragCurrentAccum = 0.0f;
        g.DragCurrentAccumDirty = false;
    }
    else if (adjust_delta != 0.0f)
    {
        g.DragCurrentAccum += adjust_delta;
        g.DragCurrentAccumDirty = true;
    }

    if (!g.DragCurrentAccumDirty)
        return false;

    TYPE v_cur = *v;
    FLOATTYPE v_old_ref_for_accum_remainder = (FLOATTYPE)0.0f;

    float logarithmic_zero_epsilon = 0.0f; // Only valid when is_logarithmic is true
    const float zero_deadzone_halfsize = 0.0f; // Drag widgets have no deadzone (as it doesn't make sense)
    if (is_logarithmic)
    {
        // When using logarithmic sliders, we need to clamp to avoid hitting zero, but our choice of clamp value greatly affects slider precision. We attempt to use the specified precision to estimate a good lower bound.
        const int decimal_precision = is_floating_point ? ImParseFormatPrecision(format, 3) : 1;
        logarithmic_zero_epsilon = ImPow(0.1f, (float)decimal_precision);

        // Convert to parametric space, apply delta, convert back
        float v_old_parametric = ScaleRatioFromValueT<TYPE, SIGNEDTYPE, FLOATTYPE>(data_type, v_cur, v_min, v_max, is_logarithmic, logarithmic_zero_epsilon, zero_deadzone_halfsize);
        float v_new_parametric = v_old_parametric + g.DragCurrentAccum;
        v_cur = ScaleValueFromRatioT<TYPE, SIGNEDTYPE, FLOATTYPE>(data_type, v_new_parametric, v_min, v_max, is_logarithmic, logarithmic_zero_epsilon, zero_deadzone_halfsize);
        v_old_ref_for_accum_remainder = v_old_parametric;
    }
    else
    {
        v_cur += (SIGNEDTYPE)g.DragCurrentAccum;
    }

    // Round to user desired precision based on format string
    if (is_floating_point && !(flags & ImGuiSliderFlags_NoRoundToFormat))
        v_cur = RoundScalarWithFormatT<TYPE>(format, data_type, v_cur);

    // Preserve remainder after rounding has been applied. This also allow slow tweaking of values.
    g.DragCurrentAccumDirty = false;
    if (is_logarithmic)
    {
        // Convert to parametric space, apply delta, convert back
        float v_new_parametric = ScaleRatioFromValueT<TYPE, SIGNEDTYPE, FLOATTYPE>(data_type, v_cur, v_min, v_max, is_logarithmic, logarithmic_zero_epsilon, zero_deadzone_halfsize);
        g.DragCurrentAccum -= (float)(v_new_parametric - v_old_ref_for_accum_remainder);
    }
    else
    {
        g.DragCurrentAccum -= (float)((SIGNEDTYPE)v_cur - (SIGNEDTYPE)*v);
    }

    // Lose zero sign for float/double
    if (v_cur == (TYPE)-0)
        v_cur = (TYPE)0;

    // Clamp values (+ handle overflow/wrap-around for integer types)
    if (*v != v_cur && is_clamped)
    {
        if (v_cur < v_min || (v_cur > *v && adjust_delta < 0.0f && !is_floating_point))
            v_cur = v_min;
        if (v_cur > v_max || (v_cur < *v && adjust_delta > 0.0f && !is_floating_point))
            v_cur = v_max;
    }

    // Apply result
    if (*v == v_cur)
        return false;
    *v = v_cur;
    return true;
}